

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O3

bool __thiscall MeCab::Writer::writeWakati(Writer *this,Lattice *lattice,StringBuffer *os)

{
  int iVar1;
  undefined4 extraout_var;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX_00;
  long lVar2;
  
  iVar1 = (*lattice->_vptr_Lattice[2])(lattice);
  __buf = extraout_RDX;
  for (lVar2 = *(long *)(CONCAT44(extraout_var,iVar1) + 8); *(long *)(lVar2 + 8) != 0;
      lVar2 = *(long *)(lVar2 + 8)) {
    StringBuffer::write(os,(int)*(undefined8 *)(lVar2 + 0x30),
                        (void *)(ulong)*(ushort *)(lVar2 + 0x44),in_RCX);
    StringBuffer::write(os,0x20,__buf_00,in_RCX);
    __buf = extraout_RDX_00;
  }
  StringBuffer::write(os,10,__buf,in_RCX);
  return true;
}

Assistant:

bool Writer::writeWakati(Lattice *lattice, StringBuffer *os) const {
  for (const Node *node = lattice->bos_node()->next;
       node->next; node = node->next) {
    os->write(node->surface, node->length);
    *os << ' ';
  }
  *os << '\n';
  return true;
}